

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warn.cc
# Opt level: O0

void __thiscall re2c::Warn::condition_order(Warn *this,uint32_t line)

{
  bool error;
  bool e;
  uint32_t line_local;
  Warn *this_local;
  
  if ((this->mask[0] & 1) != 0) {
    error = (this->mask[0] & 2) != 0;
    this->error_accuml = (this->error_accuml & 1U) != 0 || error;
    warning(names,line,error,
            "looks like you use hardcoded numbers instead of autogenerated condition names: better add \'/*!types:re2c*/\' directive or \'-t, --type-header\' option and don\'t rely on fixed condition order."
           );
  }
  return;
}

Assistant:

void Warn::condition_order (uint32_t line)
{
	if (mask[CONDITION_ORDER] & WARNING)
	{
		const bool e = mask[CONDITION_ORDER] & ERROR;
		error_accuml |= e;
		warning (names[CONDITION_ORDER], line, e,
			"looks like you use hardcoded numbers instead of autogenerated condition names: "
			"better add '/*!types:re2c*/' directive or '-t, --type-header' option "
			"and don't rely on fixed condition order.");
	}
}